

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

QByteArray * __thiscall
QByteArray::replace(QByteArray *this,qsizetype pos,qsizetype len,QByteArrayView after)

{
  QVLAStorage<1UL,_1UL,_256LL> *__s;
  qsizetype alloc;
  Data *pDVar1;
  QByteArray *pQVar2;
  size_t __n;
  char *pcVar3;
  ulong uVar4;
  char *__value;
  long in_FS_OFFSET;
  QByteArrayView after_00;
  back_insert_iterator<QVarLengthArray<char,_256LL>_> local_158;
  QVarLengthArray<char,_256LL> local_150;
  long local_38;
  
  __value = after.m_data;
  __n = after.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = (this->d).ptr;
  alloc = (this->d).size;
  if (__value < pcVar3 + alloc && pcVar3 <= __value) {
    __s = &local_150.super_QVLAStorage<1UL,_1UL,_256LL>;
    memset(__s,0xaa,0x100);
    local_150.super_QVLABase<char>.super_QVLABaseBase.a = 0x100;
    local_150.super_QVLABase<char>.super_QVLABaseBase.s = 0;
    local_150.super_QVLABase<char>.super_QVLABaseBase.ptr = __s;
    if ((long)__n < 0x101) {
      local_158.container = &local_150;
      if (0 < (long)__n) goto LAB_0030166c;
    }
    else {
      QVLABase<char>::reallocate_impl(&local_150.super_QVLABase<char>,0x100,__s,0,__n);
LAB_0030166c:
      local_158.container = &local_150;
      uVar4 = __n + 1;
      do {
        std::back_insert_iterator<QVarLengthArray<char,_256LL>_>::operator=(&local_158,__value);
        __value = __value + 1;
        uVar4 = uVar4 - 1;
      } while (1 < uVar4);
    }
    after_00.m_data = (storage_type *)local_150.super_QVLABase<char>.super_QVLABaseBase.ptr;
    after_00.m_size = local_150.super_QVLABase<char>.super_QVLABaseBase.s;
    this = replace(this,pos,len,after_00);
    if ((QVLAStorage<1UL,_1UL,_256LL> *)local_150.super_QVLABase<char>.super_QVLABaseBase.ptr !=
        &local_150.super_QVLAStorage<1UL,_1UL,_256LL>) {
      QtPrivate::sizedFree
                (local_150.super_QVLABase<char>.super_QVLABaseBase.ptr,
                 local_150.super_QVLABase<char>.super_QVLABaseBase.a);
    }
  }
  else {
    if ((__n != len) || (alloc < (long)(__n + pos))) {
      remove(this,(char *)pos);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        pQVar2 = insert(this,pos,after);
        return pQVar2;
      }
      goto LAB_0030177d;
    }
    if (0 < (long)__n) {
      pDVar1 = (this->d).d;
      if ((pDVar1 == (Data *)0x0) ||
         (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        reallocData(this,alloc,KeepSize);
        pcVar3 = (this->d).ptr;
      }
      memcpy(pcVar3 + pos,__value,__n);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
LAB_0030177d:
  __stack_chk_fail();
}

Assistant:

QByteArray &QByteArray::replace(qsizetype pos, qsizetype len, QByteArrayView after)
{
    if (QtPrivate::q_points_into_range(after.data(), d)) {
        QVarLengthArray copy(after.data(), after.data() + after.size());
        return replace(pos, len, QByteArrayView{copy});
    }
    if (len == after.size() && (pos + len <= size())) {
        // same size: in-place replacement possible
        if (len > 0) {
            detach();
            memcpy(d.data() + pos, after.data(), len*sizeof(char));
        }
        return *this;
    } else {
        // ### optimize me
        remove(pos, len);
        return insert(pos, after);
    }
}